

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_impl.h
# Opt level: O3

int secp256k1_xonly_pubkey_from_pubkey
              (secp256k1_context *ctx,secp256k1_xonly_pubkey *xonly_pubkey,int *pk_parity,
              secp256k1_pubkey *pubkey)

{
  int iVar1;
  secp256k1_ge pk;
  secp256k1_ge sStack_78;
  
  if (ctx == (secp256k1_context *)0x0) {
    secp256k1_xonly_pubkey_from_pubkey_cold_3();
  }
  else if (xonly_pubkey != (secp256k1_xonly_pubkey *)0x0) {
    if (pubkey == (secp256k1_pubkey *)0x0) {
      secp256k1_xonly_pubkey_from_pubkey_cold_1();
      return 0;
    }
    iVar1 = secp256k1_pubkey_load(ctx,&sStack_78,pubkey);
    if (iVar1 == 0) {
      return 0;
    }
    iVar1 = secp256k1_extrakeys_ge_even_y(&sStack_78);
    if (pk_parity != (int *)0x0) {
      *pk_parity = iVar1;
    }
    secp256k1_ge_to_bytes(xonly_pubkey->data,&sStack_78);
    return 1;
  }
  secp256k1_xonly_pubkey_from_pubkey_cold_2();
  return 0;
}

Assistant:

int secp256k1_xonly_pubkey_from_pubkey(const secp256k1_context* ctx, secp256k1_xonly_pubkey *xonly_pubkey, int *pk_parity, const secp256k1_pubkey *pubkey) {
    secp256k1_ge pk;
    int tmp;

    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(xonly_pubkey != NULL);
    ARG_CHECK(pubkey != NULL);

    if (!secp256k1_pubkey_load(ctx, &pk, pubkey)) {
        return 0;
    }
    tmp = secp256k1_extrakeys_ge_even_y(&pk);
    if (pk_parity != NULL) {
        *pk_parity = tmp;
    }
    secp256k1_xonly_pubkey_save(xonly_pubkey, &pk);
    return 1;
}